

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

PropertyId __thiscall
Js::FunctionBody::GetReferencedPropertyIdWithMapIndex(FunctionBody *this,uint mapIndex)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  PropertyId *pPVar4;
  undefined4 *puVar5;
  uint mapIndex_local;
  FunctionBody *this_local;
  
  pPVar4 = GetReferencedPropertyIdMap(this);
  if (pPVar4 == (PropertyId *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x10ec,"(this->GetReferencedPropertyIdMap())",
                                "this->GetReferencedPropertyIdMap()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  uVar3 = GetReferencedPropertyIdCount(this);
  if (uVar3 <= mapIndex) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x10ed,"(mapIndex < this->GetReferencedPropertyIdCount())",
                                "mapIndex < this->GetReferencedPropertyIdCount()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pPVar4 = GetReferencedPropertyIdMap(this);
  return pPVar4[mapIndex];
}

Assistant:

PropertyId FunctionBody::GetReferencedPropertyIdWithMapIndex(uint mapIndex)
    {
        Assert(this->GetReferencedPropertyIdMap());
        Assert(mapIndex < this->GetReferencedPropertyIdCount());
        return this->GetReferencedPropertyIdMap()[mapIndex];
    }